

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadVer.c
# Opt level: O1

int Prs_ManReadArguments(Prs_Man_t *p)

{
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  Prs_Ntk_t *pPVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  byte *pbVar8;
  int iVar9;
  int Value;
  int extraout_EDX;
  int extraout_EDX_00;
  ulong uVar10;
  uint uVar11;
  byte *pbVar12;
  char *pcVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  Vec_Int_t *vSigsR [3];
  Vec_Int_t *vSigs [3];
  Vec_Int_t *local_68 [4];
  Vec_Int_t *local_48 [3];
  
  pPVar4 = p->pNtk;
  local_48[0] = &pPVar4->vInputs;
  local_48[1] = &pPVar4->vOutputs;
  local_48[2] = &pPVar4->vInouts;
  local_68[0] = &pPVar4->vInputsR;
  local_68[1] = &pPVar4->vOutputsR;
  local_68[2] = &pPVar4->vInoutsR;
  if (*p->pCur != '(') {
    __assert_fail("Prs_ManIsChar(p, \'(\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                  ,0x477,"int Prs_ManReadArguments(Prs_Man_t *)");
  }
  pbVar8 = (byte *)(p->pCur + 1);
  p->pCur = (char *)pbVar8;
  pbVar12 = (byte *)p->pLimit;
  while (pbVar8 < pbVar12) {
    while( true ) {
      uVar10 = (ulong)*pbVar8;
      if (0x2f < uVar10) goto LAB_003e82bb;
      if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) break;
      pbVar8 = pbVar8 + 1;
      p->pCur = (char *)pbVar8;
    }
    if (uVar10 != 0x2f) {
      if (uVar10 != 0) {
LAB_003e82bb:
        if (*p->pCur == ')') {
          return 1;
        }
        pcVar1 = p->ErrorStr;
        uVar11 = 0xffffffff;
        iVar6 = 0;
        goto LAB_003e82e6;
      }
      break;
    }
    if (pbVar8[1] != 0x2a) {
      if (pbVar8[1] == 0x2f) {
        pbVar8 = pbVar8 + 2;
        p->pCur = (char *)pbVar8;
        if (pbVar8 < pbVar12) {
          while (*pbVar8 != 10) {
            pbVar8 = pbVar8 + 1;
            p->pCur = (char *)pbVar8;
            if (pbVar8 == pbVar12) goto LAB_003e82bb;
          }
          pbVar8 = pbVar8 + 1;
          goto LAB_003e824f;
        }
      }
      goto LAB_003e82bb;
    }
    pbVar8 = pbVar8 + 2;
    p->pCur = (char *)pbVar8;
    if (pbVar12 <= pbVar8) goto LAB_003e82bb;
    while ((*pbVar8 != 0x2a || (pbVar8[1] != 0x2f))) {
      pbVar8 = pbVar8 + 1;
      p->pCur = (char *)pbVar8;
      if (pbVar8 == pbVar12) goto LAB_003e82bb;
    }
    pbVar8 = pbVar8 + 2;
LAB_003e824f:
    p->pCur = (char *)pbVar8;
  }
  if (p->ErrorStr[0] == '\0') {
    builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
    if (p->ErrorStr[0] == '\0') {
      builtin_strncpy(p->ErrorStr,"Error number 30.",0x11);
      return 0;
    }
  }
LAB_003e8a7a:
  __assert_fail("!p->ErrorStr[0]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaPrs.h"
                ,0xc0,"int Prs_ManErrorSet(Prs_Man_t *, char *, int)");
LAB_003e82e6:
  pbVar12 = (byte *)p->pCur;
  bVar2 = *pbVar12;
  if (bVar2 == 0x5c) {
    pbVar12 = pbVar12 + 1;
    pbVar8 = pbVar12;
    do {
      p->pCur = (char *)pbVar8;
      bVar3 = *pbVar8;
      pbVar8 = pbVar8 + 1;
    } while (bVar3 != 0x20);
LAB_003e8346:
    uVar5 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar12,p->pCur,(int *)0x0);
  }
  else if ((bVar2 == 0x5f) || (uVar5 = 0, 0xe5 < (byte)((bVar2 & 0xdf) + 0xa5))) {
    pbVar8 = pbVar12 + 1;
    do {
      do {
        p->pCur = (char *)pbVar8;
        bVar3 = *pbVar8;
        pbVar8 = pbVar8 + 1;
      } while (0xf5 < (byte)(bVar3 - 0x3a));
    } while (((bVar3 == 0x24) || (bVar3 == 0x5f)) || (0xe5 < (byte)((bVar3 & 0xdf) + 0xa5)));
    goto LAB_003e8346;
  }
  if (uVar5 != 0) {
    pbVar12 = (byte *)p->pLimit;
    pbVar8 = (byte *)p->pCur;
    while (pbVar8 < pbVar12) {
      while( true ) {
        uVar10 = (ulong)*pbVar8;
        if (0x2f < uVar10) goto LAB_003e8466;
        if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) break;
        pbVar8 = pbVar8 + 1;
        p->pCur = (char *)pbVar8;
      }
      if (uVar10 != 0x2f) {
        if (uVar10 != 0) {
LAB_003e8466:
          iVar7 = 0;
          if ((bVar2 == 0x5c) || (iVar7 = 0, 3 < uVar5)) goto LAB_003e870f;
          uVar11 = uVar5;
          if (*p->pCur != '[') goto LAB_003e85ca;
          iVar6 = Prs_ManReadRange(p);
          if (iVar6 != 0) {
            pbVar12 = (byte *)p->pLimit;
            pbVar8 = (byte *)p->pCur;
            goto LAB_003e84aa;
          }
          if (*pcVar1 != '\0') goto LAB_003e8a7a;
          builtin_strncpy(pcVar1,"Error number 33.",0x11);
          goto LAB_003e8574;
        }
        break;
      }
      if (pbVar8[1] != 0x2a) {
        if (pbVar8[1] == 0x2f) {
          pbVar8 = pbVar8 + 2;
          p->pCur = (char *)pbVar8;
          if (pbVar8 < pbVar12) {
            while (*pbVar8 != 10) {
              pbVar8 = pbVar8 + 1;
              p->pCur = (char *)pbVar8;
              if (pbVar8 == pbVar12) goto LAB_003e8466;
            }
            pbVar8 = pbVar8 + 1;
            goto LAB_003e8404;
          }
        }
        goto LAB_003e8466;
      }
      pbVar8 = pbVar8 + 2;
      p->pCur = (char *)pbVar8;
      if (pbVar12 <= pbVar8) goto LAB_003e8466;
      while ((*pbVar8 != 0x2a || (pbVar8[1] != 0x2f))) {
        pbVar8 = pbVar8 + 1;
        p->pCur = (char *)pbVar8;
        if (pbVar8 == pbVar12) goto LAB_003e8466;
      }
      pbVar8 = pbVar8 + 2;
LAB_003e8404:
      p->pCur = (char *)pbVar8;
    }
    if (*pcVar1 == '\0') {
      builtin_strncpy(pcVar1,"Unexpectedly reached end-of-file.",0x22);
      if (*pcVar1 == '\0') {
        uVar14._0_1_ = ' ';
        uVar14._1_1_ = '3';
        uVar14._2_1_ = '2';
        uVar14._3_1_ = '.';
        goto LAB_003e885a;
      }
    }
    goto LAB_003e8a7a;
  }
  if (*pcVar1 != '\0') goto LAB_003e8a7a;
  uVar14._0_1_ = ' ';
  uVar14._1_1_ = '3';
  uVar14._2_1_ = '1';
  uVar14._3_1_ = '.';
LAB_003e885a:
  pcVar1[0] = 'E';
  pcVar1[1] = 'r';
  pcVar1[2] = 'r';
  pcVar1[3] = 'o';
  p->ErrorStr[4] = 'r';
  p->ErrorStr[5] = ' ';
  p->ErrorStr[6] = 'n';
  p->ErrorStr[7] = 'u';
  p->ErrorStr[8] = 'm';
  p->ErrorStr[9] = 'b';
  p->ErrorStr[10] = 'e';
  p->ErrorStr[0xb] = 'r';
  *(undefined4 *)(p->ErrorStr + 0xc) = uVar14;
  p->ErrorStr[0x10] = '\0';
LAB_003e8863:
  iVar7 = 1;
  goto LAB_003e8868;
LAB_003e84aa:
  if (pbVar12 <= pbVar8) goto LAB_003e858c;
  while( true ) {
    uVar10 = (ulong)*pbVar8;
    if (0x2f < uVar10) goto LAB_003e85ca;
    if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) break;
    pbVar8 = pbVar8 + 1;
    p->pCur = (char *)pbVar8;
  }
  if (uVar10 != 0x2f) {
    if (uVar10 != 0) goto LAB_003e85ca;
    goto LAB_003e858c;
  }
  if (pbVar8[1] == 0x2a) {
    pbVar8 = pbVar8 + 2;
    p->pCur = (char *)pbVar8;
    if (pbVar12 <= pbVar8) goto LAB_003e85ca;
    while ((*pbVar8 != 0x2a || (pbVar8[1] != 0x2f))) {
      pbVar8 = pbVar8 + 1;
      p->pCur = (char *)pbVar8;
      if (pbVar8 == pbVar12) goto LAB_003e85ca;
    }
    pbVar8 = pbVar8 + 2;
  }
  else {
    if (pbVar8[1] != 0x2f) goto LAB_003e85ca;
    pbVar8 = pbVar8 + 2;
    p->pCur = (char *)pbVar8;
    if (pbVar12 <= pbVar8) goto LAB_003e85ca;
    while (*pbVar8 != 10) {
      pbVar8 = pbVar8 + 1;
      p->pCur = (char *)pbVar8;
      if (pbVar8 == pbVar12) goto LAB_003e85ca;
    }
    pbVar8 = pbVar8 + 1;
  }
  p->pCur = (char *)pbVar8;
  goto LAB_003e84aa;
LAB_003e858c:
  if (*pcVar1 != '\0') goto LAB_003e8a7a;
  builtin_strncpy(pcVar1,"Unexpectedly reached end-of-file.",0x22);
  if (*pcVar1 != '\0') goto LAB_003e8a7a;
  uVar15._0_1_ = ' ';
  uVar15._1_1_ = '3';
  uVar15._2_1_ = '4';
  uVar15._3_1_ = '.';
LAB_003e8985:
  pcVar1[0] = 'E';
  pcVar1[1] = 'r';
  pcVar1[2] = 'r';
  pcVar1[3] = 'o';
  p->ErrorStr[4] = 'r';
  p->ErrorStr[5] = ' ';
  p->ErrorStr[6] = 'n';
  p->ErrorStr[7] = 'u';
  p->ErrorStr[8] = 'm';
  p->ErrorStr[9] = 'b';
  p->ErrorStr[10] = 'e';
  p->ErrorStr[0xb] = 'r';
  *(undefined4 *)(p->ErrorStr + 0xc) = uVar15;
  p->ErrorStr[0x10] = '\0';
LAB_003e8993:
  iVar7 = 1;
LAB_003e8868:
  if (iVar7 != 0) {
    if (iVar7 != 3) {
      return 0;
    }
    if (*p->pCur != ')') {
      __assert_fail("Prs_ManIsChar(p, \')\')",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaReadVer.c"
                    ,0x4aa,"int Prs_ManReadArguments(Prs_Man_t *)");
    }
    return 1;
  }
  goto LAB_003e82e6;
LAB_003e85ca:
  pbVar12 = (byte *)p->pCur;
  bVar2 = *pbVar12;
  if (bVar2 == 0x5c) {
    pbVar12 = pbVar12 + 1;
    pbVar8 = pbVar12;
    do {
      p->pCur = (char *)pbVar8;
      bVar2 = *pbVar8;
      pbVar8 = pbVar8 + 1;
    } while (bVar2 != 0x20);
LAB_003e8626:
    uVar5 = Abc_NamStrFindOrAddLim(p->pStrs,(char *)pbVar12,p->pCur,(int *)0x0);
  }
  else if ((bVar2 == 0x5f) || (uVar5 = 0, 0xe5 < (byte)((bVar2 & 0xdf) + 0xa5))) {
    pbVar8 = pbVar12 + 1;
    do {
      do {
        p->pCur = (char *)pbVar8;
        bVar2 = *pbVar8;
        pbVar8 = pbVar8 + 1;
      } while (0xf5 < (byte)(bVar2 - 0x3a));
    } while (((bVar2 == 0x24) || (bVar2 == 0x5f)) || (0xe5 < (byte)((bVar2 & 0xdf) + 0xa5)));
    goto LAB_003e8626;
  }
  if (uVar5 == 0xf) {
    pbVar12 = (byte *)p->pLimit;
    pbVar8 = (byte *)p->pCur;
    while (pbVar8 < pbVar12) {
      while( true ) {
        uVar10 = (ulong)*pbVar8;
        if (0x2f < uVar10) goto LAB_003e899c;
        if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) break;
        pbVar8 = pbVar8 + 1;
        p->pCur = (char *)pbVar8;
      }
      if (uVar10 != 0x2f) {
        if (uVar10 != 0) {
LAB_003e899c:
          if (*p->pCur == '[') {
            iVar6 = Prs_ManReadRange(p);
            if (iVar6 != 0) {
              iVar7 = Prs_ManUtilSkipSpaces(p);
              if (iVar7 == 0) goto LAB_003e89ce;
              pcVar13 = "Error number 34.";
              iVar7 = extraout_EDX;
              goto LAB_003e89f4;
            }
            Prs_ManErrorSet(p,"Error number 33.",Value);
LAB_003e8574:
            iVar6 = 0;
            goto LAB_003e8993;
          }
LAB_003e89ce:
          uVar5 = Prs_ManReadName(p);
          if (uVar5 != 0) {
            iVar7 = 1;
            goto LAB_003e870f;
          }
          pcVar13 = "Error number 35.";
          iVar7 = extraout_EDX_00;
LAB_003e89f4:
          Prs_ManErrorSet(p,pcVar13,iVar7);
          goto LAB_003e8993;
        }
        break;
      }
      if (pbVar8[1] != 0x2a) {
        if (pbVar8[1] == 0x2f) {
          pbVar8 = pbVar8 + 2;
          p->pCur = (char *)pbVar8;
          if (pbVar8 < pbVar12) {
            while (*pbVar8 != 10) {
              pbVar8 = pbVar8 + 1;
              p->pCur = (char *)pbVar8;
              if (pbVar8 == pbVar12) goto LAB_003e899c;
            }
            pbVar8 = pbVar8 + 1;
            goto LAB_003e86fe;
          }
        }
        goto LAB_003e899c;
      }
      pbVar8 = pbVar8 + 2;
      p->pCur = (char *)pbVar8;
      if (pbVar12 <= pbVar8) goto LAB_003e899c;
      while ((*pbVar8 != 0x2a || (pbVar8[1] != 0x2f))) {
        pbVar8 = pbVar8 + 1;
        p->pCur = (char *)pbVar8;
        if (pbVar8 == pbVar12) goto LAB_003e899c;
      }
      pbVar8 = pbVar8 + 2;
LAB_003e86fe:
      p->pCur = (char *)pbVar8;
    }
    if (*pcVar1 != '\0') goto LAB_003e8a7a;
    builtin_strncpy(pcVar1,"Unexpectedly reached end-of-file.",0x22);
    if (*pcVar1 != '\0') goto LAB_003e8a7a;
    uVar15._0_1_ = ' ';
    uVar15._1_1_ = '3';
    uVar15._2_1_ = '2';
    uVar15._3_1_ = '.';
  }
  else {
    if (uVar5 != 0) {
      iVar7 = 0;
LAB_003e870f:
      if (0 < (int)uVar11) {
        Vec_IntPush(local_48[uVar11 - 1],uVar5);
        if (iVar6 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        Vec_IntPush(local_68[uVar11 - 1],iVar7 + iVar6 * 2);
        if (3 < uVar11) {
          __assert_fail("!(Att >> 2)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x13c,"int Abc_Var2Lit2(int, int)");
        }
        Vec_IntPush(&p->pNtk->vOrder,uVar11 + uVar5 * 4);
      }
      pbVar12 = (byte *)p->pLimit;
      pbVar8 = (byte *)p->pCur;
      while (pbVar8 < pbVar12) {
        while( true ) {
          uVar10 = (ulong)*pbVar8;
          if (0x2f < uVar10) goto LAB_003e8875;
          if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) break;
          pbVar8 = pbVar8 + 1;
          p->pCur = (char *)pbVar8;
        }
        if (uVar10 != 0x2f) {
          if (uVar10 != 0) {
LAB_003e8875:
            pbVar8 = (byte *)p->pCur;
            if (*pbVar8 != 0x29) {
              if (*pbVar8 != 0x2c) {
                pcVar13 = "Expecting comma in the instance.";
LAB_003e8a46:
                Prs_ManErrorSet(p,pcVar13,(int)pbVar8);
                goto LAB_003e8863;
              }
              goto LAB_003e888e;
            }
            iVar7 = 3;
            goto LAB_003e8868;
          }
          break;
        }
        if (pbVar8[1] != 0x2a) {
          if (pbVar8[1] == 0x2f) {
            pbVar8 = pbVar8 + 2;
            p->pCur = (char *)pbVar8;
            if (pbVar8 < pbVar12) {
              while (*pbVar8 != 10) {
                pbVar8 = pbVar8 + 1;
                p->pCur = (char *)pbVar8;
                if (pbVar8 == pbVar12) goto LAB_003e8875;
              }
              pbVar8 = pbVar8 + 1;
              goto LAB_003e8813;
            }
          }
          goto LAB_003e8875;
        }
        pbVar8 = pbVar8 + 2;
        p->pCur = (char *)pbVar8;
        if (pbVar12 <= pbVar8) goto LAB_003e8875;
        while ((*pbVar8 != 0x2a || (pbVar8[1] != 0x2f))) {
          pbVar8 = pbVar8 + 1;
          p->pCur = (char *)pbVar8;
          if (pbVar8 == pbVar12) goto LAB_003e8875;
        }
        pbVar8 = pbVar8 + 2;
LAB_003e8813:
        p->pCur = (char *)pbVar8;
      }
      if (*pcVar1 != '\0') goto LAB_003e8a7a;
      builtin_strncpy(pcVar1,"Unexpectedly reached end-of-file.",0x22);
      if (*pcVar1 != '\0') goto LAB_003e8a7a;
      uVar14._0_1_ = ' ';
      uVar14._1_1_ = '3';
      uVar14._2_1_ = '6';
      uVar14._3_1_ = '.';
      goto LAB_003e885a;
    }
    if (*pcVar1 != '\0') goto LAB_003e8a7a;
    uVar15._0_1_ = ' ';
    uVar15._1_1_ = '3';
    uVar15._2_1_ = '5';
    uVar15._3_1_ = '.';
  }
  goto LAB_003e8985;
LAB_003e888e:
  pbVar8 = pbVar8 + 1;
  do {
    p->pCur = (char *)pbVar8;
    if (pbVar12 <= pbVar8) {
LAB_003e8a18:
      if (*pcVar1 != '\0') goto LAB_003e8a7a;
      builtin_strncpy(pcVar1,"Unexpectedly reached end-of-file.",0x22);
      pcVar13 = "Error number 36.";
      goto LAB_003e8a46;
    }
    while( true ) {
      uVar10 = (ulong)*pbVar8;
      iVar7 = 0;
      iVar9 = 0;
      if (0x2f < uVar10) goto LAB_003e8868;
      if ((0x100002600U >> (uVar10 & 0x3f) & 1) == 0) break;
      pbVar8 = pbVar8 + 1;
      p->pCur = (char *)pbVar8;
    }
    if (uVar10 != 0x2f) {
      iVar7 = iVar9;
      if (uVar10 == 0) goto LAB_003e8a18;
      goto LAB_003e8868;
    }
    if (pbVar8[1] != 0x2a) break;
    pbVar8 = pbVar8 + 2;
    p->pCur = (char *)pbVar8;
    if (pbVar12 <= pbVar8) goto LAB_003e8868;
    while ((*pbVar8 != 0x2a || (pbVar8[1] != 0x2f))) {
      pbVar8 = pbVar8 + 1;
      p->pCur = (char *)pbVar8;
      if (pbVar8 == pbVar12) goto LAB_003e8868;
    }
    pbVar8 = pbVar8 + 2;
  } while( true );
  iVar7 = iVar9;
  if (pbVar8[1] != 0x2f) goto LAB_003e8868;
  pbVar8 = pbVar8 + 2;
  p->pCur = (char *)pbVar8;
  if (pbVar12 <= pbVar8) goto LAB_003e8868;
  while (*pbVar8 != 10) {
    pbVar8 = pbVar8 + 1;
    p->pCur = (char *)pbVar8;
    if (pbVar8 == pbVar12) goto LAB_003e8868;
  }
  goto LAB_003e888e;
}

Assistant:

static inline int Prs_ManReadArguments( Prs_Man_t * p )
{
    int iRange = 0, iType = -1;
    Vec_Int_t * vSigs[3]  = { &p->pNtk->vInputs,  &p->pNtk->vOutputs,  &p->pNtk->vInouts  };
    Vec_Int_t * vSigsR[3] = { &p->pNtk->vInputsR, &p->pNtk->vOutputsR, &p->pNtk->vInoutsR };
    assert( Prs_ManIsChar(p, '(') );
    p->pCur++;
    if ( Prs_ManUtilSkipSpaces(p) )             return Prs_ManErrorSet(p, "Error number 30.", 0);
    if ( Prs_ManIsChar(p, ')') )
        return 1;
    while ( 1 )
    {
        int fEscape = Prs_ManIsChar(p, '\\');
        int iName = Prs_ManReadName( p );
        int fSigned = 0;
        if ( iName == 0 )                       return Prs_ManErrorSet(p, "Error number 31.", 0);
        if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 32.", 0);
        if ( iName >= PRS_VER_INPUT && iName <= PRS_VER_INOUT && !fEscape ) // declaration
        {
            iType = iName;
            if ( Prs_ManIsChar(p, '[') )
            {
                iRange = Prs_ManReadRange(p);
                if ( iRange == 0 )              return Prs_ManErrorSet(p, "Error number 33.", 0);
                if ( Prs_ManUtilSkipSpaces(p) ) return Prs_ManErrorSet(p, "Error number 34.", 0);
            }
            iName = Prs_ManReadName( p );
            if ( iName == 0 )                   return Prs_ManErrorSet(p, "Error number 35.", 0);
            if ( iName == PRS_VER_SIGNED )
            {
                fSigned = 1;
                if ( Prs_ManUtilSkipSpaces(p) ) return Prs_ManErrorSet(p, "Error number 32.", 0);
                if ( Prs_ManIsChar(p, '[') )
                {
                    iRange = Prs_ManReadRange(p);
                    if ( iRange == 0 )              return Prs_ManErrorSet(p, "Error number 33.", 0);
                    if ( Prs_ManUtilSkipSpaces(p) ) return Prs_ManErrorSet(p, "Error number 34.", 0);
                }
                iName = Prs_ManReadName( p );
                if ( iName == 0 )               return Prs_ManErrorSet(p, "Error number 35.", 0);
            }
        }
        if ( iType > 0 )
        {
            Vec_IntPush( vSigs[iType - PRS_VER_INPUT], iName );
            Vec_IntPush( vSigsR[iType - PRS_VER_INPUT], Abc_Var2Lit(iRange, fSigned) );
            Vec_IntPush( &p->pNtk->vOrder, Abc_Var2Lit2(iName, iType) );
        }
        if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 36.", 0);
        if ( Prs_ManIsChar(p, ')') )
            break;
        if ( !Prs_ManIsChar(p, ',') )           return Prs_ManErrorSet(p, "Expecting comma in the instance.", 0);
        p->pCur++;
        if ( Prs_ManUtilSkipSpaces(p) )         return Prs_ManErrorSet(p, "Error number 36.", 0);
    }
    // check final
    assert( Prs_ManIsChar(p, ')') );
    return 1;
}